

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O0

void __thiscall VMState::SetVar(VMState *this,int pos,ExpressionPtr *exp,bool expIsStatementLike)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  Error *this_01;
  element_type *peVar4;
  reference pvVar5;
  BinaryOperatorExpression *this_02;
  ExpressionStatement *pEVar6;
  shared_ptr<Expression> local_110;
  ExpressionPtr local_100;
  shared_ptr<Statement> local_f0;
  shared_ptr<Statement> local_e0;
  undefined1 local_c9;
  shared_ptr<Expression> local_c8;
  undefined1 local_b8 [8];
  ExpressionStatementPtr statement;
  shared_ptr<Expression> local_a0;
  shared_ptr<Statement> local_90;
  undefined1 local_79;
  shared_ptr<Expression> local_78;
  shared_ptr<Expression> local_68;
  undefined1 local_58 [8];
  ExpressionPtr assignExp;
  byte local_21;
  bool expIsStatementLike_local;
  ExpressionPtr *exp_local;
  int pos_local;
  VMState *this_local;
  
  if ((-1 < pos) &&
     (sVar3 = std::vector<VMState::StackElement,_std::allocator<VMState::StackElement>_>::size
                        (&this->m_Stack), pos < (int)sVar3)) {
    this_00 = &assignExp.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<Expression>::shared_ptr((shared_ptr<Expression> *)this_00,exp);
    bVar1 = InitVar(this,pos,(ExpressionPtr *)this_00,false);
    std::shared_ptr<Expression>::~shared_ptr
              ((shared_ptr<Expression> *)
               &assignExp.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (!bVar1) {
      peVar4 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)exp);
      bVar1 = Expression::IsOperator(peVar4);
      local_21 = expIsStatementLike;
      if (bVar1) {
        local_21 = 1;
      }
      pvVar5 = std::vector<VMState::StackElement,_std::allocator<VMState::StackElement>_>::
               operator[](&this->m_Stack,(long)pos);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)pvVar5);
      if (bVar1) {
        pvVar5 = std::vector<VMState::StackElement,_std::allocator<VMState::StackElement>_>::
                 operator[](&this->m_Stack,(long)pos);
        peVar4 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)pvVar5);
        iVar2 = (**peVar4->_vptr_Expression)();
        if (iVar2 == 4) {
          this_02 = (BinaryOperatorExpression *)operator_new(0x30);
          local_79 = 1;
          pvVar5 = std::vector<VMState::StackElement,_std::allocator<VMState::StackElement>_>::
                   operator[](&this->m_Stack,(long)pos);
          std::shared_ptr<Expression>::shared_ptr(&local_68,&pvVar5->expression);
          std::shared_ptr<Expression>::shared_ptr(&local_78,exp);
          BinaryOperatorExpression::BinaryOperatorExpression(this_02,0x3d,&local_68,&local_78);
          local_79 = 0;
          std::shared_ptr<Expression>::shared_ptr<BinaryOperatorExpression,void>
                    ((shared_ptr<Expression> *)local_58,this_02);
          std::shared_ptr<Expression>::~shared_ptr(&local_78);
          std::shared_ptr<Expression>::~shared_ptr(&local_68);
          pEVar6 = (ExpressionStatement *)operator_new(0x28);
          statement.super___shared_ptr<ExpressionStatement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._7_1_ = 1;
          std::shared_ptr<Expression>::shared_ptr(&local_a0,(shared_ptr<Expression> *)local_58);
          ExpressionStatement::ExpressionStatement(pEVar6,&local_a0);
          statement.super___shared_ptr<ExpressionStatement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._7_1_ = 0;
          std::shared_ptr<Statement>::shared_ptr<ExpressionStatement,void>(&local_90,pEVar6);
          PushStatement(this,&local_90);
          std::shared_ptr<Statement>::~shared_ptr(&local_90);
          std::shared_ptr<Expression>::~shared_ptr(&local_a0);
          std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_58);
          return;
        }
      }
      if ((local_21 & 1) == 0) {
        pvVar5 = std::vector<VMState::StackElement,_std::allocator<VMState::StackElement>_>::
                 operator[](&this->m_Stack,(long)pos);
        std::vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>::clear
                  (&pvVar5->pendingStatements);
      }
      else {
        pEVar6 = (ExpressionStatement *)operator_new(0x28);
        local_c9 = 1;
        std::shared_ptr<Expression>::shared_ptr(&local_c8,exp);
        ExpressionStatement::ExpressionStatement(pEVar6,&local_c8);
        local_c9 = 0;
        std::shared_ptr<ExpressionStatement>::shared_ptr<ExpressionStatement,void>
                  ((shared_ptr<ExpressionStatement> *)local_b8,pEVar6);
        std::shared_ptr<Expression>::~shared_ptr(&local_c8);
        std::shared_ptr<Statement>::shared_ptr<ExpressionStatement,void>
                  (&local_e0,(shared_ptr<ExpressionStatement> *)local_b8);
        PushStatement(this,&local_e0);
        std::shared_ptr<Statement>::~shared_ptr(&local_e0);
        pvVar5 = std::vector<VMState::StackElement,_std::allocator<VMState::StackElement>_>::
                 operator[](&this->m_Stack,(long)pos);
        std::shared_ptr<Statement>::shared_ptr<ExpressionStatement,void>
                  (&local_f0,(shared_ptr<ExpressionStatement> *)local_b8);
        std::vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>::
        push_back(&pvVar5->pendingStatements,&local_f0);
        std::shared_ptr<Statement>::~shared_ptr(&local_f0);
        std::shared_ptr<ExpressionStatement>::~shared_ptr
                  ((shared_ptr<ExpressionStatement> *)local_b8);
      }
      std::shared_ptr<Expression>::shared_ptr(&local_110,exp);
      ToTemporaryVariable(&local_100);
      pvVar5 = std::vector<VMState::StackElement,_std::allocator<VMState::StackElement>_>::
               operator[](&this->m_Stack,(long)pos);
      std::shared_ptr<Expression>::operator=(&pvVar5->expression,&local_100);
      std::shared_ptr<Expression>::~shared_ptr(&local_100);
      std::shared_ptr<Expression>::~shared_ptr(&local_110);
    }
    return;
  }
  this_01 = (Error *)__cxa_allocate_exception(0x28);
  Error::Error(this_01,"Accessing non valid stack position.");
  __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
}

Assistant:

void SetVar( int pos, ExpressionPtr exp, bool expIsStatementLike = false )
	{
		if (pos < 0 || pos >= (int)m_Stack.size())
			throw Error("Accessing non valid stack position.");

		if (InitVar(pos, exp))
			return;

		if (exp->IsOperator())
			expIsStatementLike = true;

		if (m_Stack[pos].expression && m_Stack[pos].expression->GetType() == Exp_LocalVariable)
		{
			// Setting value to local variable - generate statement for this
			ExpressionPtr assignExp = ExpressionPtr(new BinaryOperatorExpression('=', m_Stack[pos].expression, exp));
			PushStatement(StatementPtr(new ExpressionStatement(assignExp)));
		}
		else
		{
			// Setting to intermediate variable
			if (expIsStatementLike)
			{
				// but expression itself may be used as statement - we must put it in pending state
				// and assure that it will be invoked only once, when not by usage of temporary
				// stack register that by explicit statement
				ExpressionStatementPtr statement = ExpressionStatementPtr(new ExpressionStatement(exp));
				PushStatement(statement);

				m_Stack[pos].pendingStatements.push_back(statement);
			}
			else
			{
				m_Stack[pos].pendingStatements.clear();
			}

			m_Stack[pos].expression = ToTemporaryVariable(exp);
		}
	}